

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O1

ElementType __thiscall
Corrade::Containers::StridedArrayView<1U,_const_Corrade::Containers::BasicStringView<const_char>_>::
operator[](StridedArrayView<1U,_const_Corrade::Containers::BasicStringView<const_char>_> *this,
          size_t i)

{
  undefined8 uVar1;
  Debug *pDVar2;
  Debug local_40 [40];
  
  if (i < (this->_size)._data[0]) {
    return (ElementType)(i * (this->_stride)._data[0] + (long)this->_data);
  }
  uVar1 = Corrade::Utility::Error::defaultOutput();
  Corrade::Utility::Error::Error((Error *)local_40,uVar1,0);
  pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<
                              (local_40,"Containers::StridedArrayView::operator[](): index");
  pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar2,i);
  pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar2,"out of range for");
  pDVar2 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar2,(this->_size)._data[0]);
  Corrade::Utility::Debug::operator<<(pDVar2,"elements");
  Corrade::Utility::Error::~Error((Error *)local_40);
  abort();
}

Assistant:

auto StridedArrayView<dimensions, T>::operator[](const std::size_t i) const -> ElementType {
    CORRADE_DEBUG_ASSERT(i < _size._data[0], "Containers::StridedArrayView::operator[](): index" << i << "out of range for" << _size._data[0] << "elements", (Implementation::StridedElement<dimensions, T>::get(_data, _size, _stride, i)));
    return Implementation::StridedElement<dimensions, T>::get(_data, _size, _stride, i);
}